

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O3

void __thiscall duckdb::TextTreeRenderer::Render(TextTreeRenderer *this,Pipeline *op,ostream *ss)

{
  int iVar1;
  type this_00;
  _Tuple_impl<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[]>_>
  local_20;
  
  RenderTree::CreateRenderTree((RenderTree *)&local_20,op);
  this_00 = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                      ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>
                        *)&local_20);
  iVar1 = (*(this->super_TreeRenderer)._vptr_TreeRenderer[3])(this);
  if ((char)iVar1 == '\0') {
    RenderTree::SanitizeKeyNames(this_00);
  }
  (*(this->super_TreeRenderer)._vptr_TreeRenderer[2])(this,this_00,ss);
  if (local_20.
      super__Head_base<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_false>
      ._M_head_impl !=
      (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true> *)0x0)
  {
    ::std::default_delete<duckdb::RenderTree>::operator()
              ((default_delete<duckdb::RenderTree> *)&local_20,
               (RenderTree *)
               local_20.
               super__Head_base<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_false>
               ._M_head_impl);
  }
  return;
}

Assistant:

void TextTreeRenderer::Render(const Pipeline &op, std::ostream &ss) {
	auto tree = RenderTree::CreateRenderTree(op);
	ToStream(*tree, ss);
}